

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O2

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::Reset
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,ChContactable_1vars<6> *mobjA,ChContactable_1vars<6> *mobjB,ChCollisionInfo *cinfo,
          ChMaterialCompositeNSC *mat)

{
  ChMatrix33<double> *pCVar1;
  type_constraint_tuple_a *this_00;
  type_constraint_tuple_b *this_01;
  type_constraint_tuple_a *this_02;
  type_constraint_tuple_b *this_03;
  type_constraint_tuple_a *this_04;
  type_constraint_tuple_b *this_05;
  ChContactable_1vars<6> *pCVar2;
  float fVar3;
  double dVar4;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::Reset
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             mobjA,mobjB,cinfo,mat);
  this_00 = &(this->Rx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_00,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_01 = &(this->Rx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_01,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objB)->super_ChVariableTupleCarrier_1vars<6>);
  this_02 = &(this->Ru).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_02,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_03 = &(this->Ru).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_03,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objB)->super_ChVariableTupleCarrier_1vars<6>);
  this_04 = &(this->Rv).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_04,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_05 = &(this->Rv).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_05,&((this->
                       super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                       ).
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                      .objB)->super_ChVariableTupleCarrier_1vars<6>);
  fVar3 = mat->spinning_friction;
  (this->Rx).rollingfriction = mat->rolling_friction;
  (this->Rx).spinningfriction = fVar3;
  fVar3 = mat->complianceSpin;
  pCVar1 = &(this->
            super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
            super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
            contact_plane;
  this->complianceRoll = mat->complianceRoll;
  this->complianceSpin = fVar3;
  pCVar2 = (this->
           super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
           objA;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0x12])
            (pCVar2,&(this->
                     super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                     ).
                     super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                     .p1,pCVar1,this_00,this_02,this_04,0);
  pCVar2 = (this->
           super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
           objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0x12])
            (pCVar2,&(this->
                     super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                     ).
                     super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                     .p2,pCVar1,this_01,this_03,this_05,1);
  dVar4 = DAT_011dd3e0;
  if (this != (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
               *)(sBulletDNAstr64 + 0x2fc8)) {
    (this->react_torque).m_data[0] = VNULL;
    (this->react_torque).m_data[1] = dVar4;
    (this->react_torque).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

virtual void Reset(Ta* mobjA,                                ///< collidable object A
                       Tb* mobjB,                                ///< collidable object B
                       const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                       const ChMaterialCompositeNSC& mat         ///< composite material
                       ) override {
        // Invoke base class method to reset normal and sliding constraints
        ChContactNSC<Ta, Tb>::Reset(mobjA, mobjB, cinfo, mat);

        Rx.Get_tuple_a().SetVariables(*this->objA);
        Rx.Get_tuple_b().SetVariables(*this->objB);
        Ru.Get_tuple_a().SetVariables(*this->objA);
        Ru.Get_tuple_b().SetVariables(*this->objB);
        Rv.Get_tuple_a().SetVariables(*this->objA);
        Rv.Get_tuple_b().SetVariables(*this->objB);

        // Cache composite material properties
        Rx.SetRollingFrictionCoefficient(mat.rolling_friction);
        Rx.SetSpinningFrictionCoefficient(mat.spinning_friction);

        this->complianceRoll = mat.complianceRoll;
        this->complianceSpin = mat.complianceSpin;

        // COMPUTE JACOBIANS

        // delegate objA to compute its half of jacobian
        this->objA->ComputeJacobianForRollingContactPart(this->p1, this->contact_plane, Rx.Get_tuple_a(),
                                                         Ru.Get_tuple_a(), Rv.Get_tuple_a(), false);

        // delegate objB to compute its half of jacobian
        this->objB->ComputeJacobianForRollingContactPart(this->p2, this->contact_plane, Rx.Get_tuple_b(),
                                                         Ru.Get_tuple_b(), Rv.Get_tuple_b(), true);

        this->react_torque = VNULL;
    }